

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_cabac.c
# Opt level: O0

h264_cabac_context * h264_cabac_new(h264_slice *slice)

{
  h264_cabac_context *cabac_00;
  int local_20;
  int local_1c;
  int mode;
  int i;
  h264_cabac_context *cabac;
  h264_slice *slice_local;
  
  cabac_00 = (h264_cabac_context *)calloc(0x830,1);
  cabac_00->slice = slice;
  if ((slice->slice_type == 2) || (slice->slice_type == 4)) {
    local_20 = 0;
  }
  else {
    local_20 = slice->cabac_init_idc + 1;
  }
  for (local_1c = 0; local_1c < 0x407; local_1c = local_1c + 1) {
    init_ctx(cabac_00,local_1c,ctx_init_tab[local_1c] + local_20);
  }
  return cabac_00;
}

Assistant:

struct h264_cabac_context *h264_cabac_new(struct h264_slice *slice) {
	struct h264_cabac_context *cabac = calloc (sizeof *cabac, 1);
	cabac->slice = slice;
	int i;
	int mode;
	if (slice->slice_type == H264_SLICE_TYPE_I || slice->slice_type == H264_SLICE_TYPE_SI)
		mode = 0;
	else
		mode = slice->cabac_init_idc + 1;
	for (i = 0; i < H264_CABAC_CTXIDX_NUM; i++)
		init_ctx(cabac, i, &ctx_init_tab[i][mode]);
	return cabac;
}